

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_read_compressed_img_plane
              (fitsfile *fptr,int datatype,int bytesperpixel,long nplane,LONGLONG *firstcoord,
              LONGLONG *lastcoord,long *inc,long *naxes,int nullcheck,void *nullval,void *array,
              char *nullarray,int *anynul,long *nread,int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int tnull;
  int local_bc;
  long *local_b8;
  long local_b0;
  fitsfile *local_a8;
  char *local_a0;
  LONGLONG blc [6];
  long local_68;
  long local_60;
  long local_58;
  
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  *nread = 0;
  blc[2] = nplane + 1;
  local_b0 = (long)bytesperpixel;
  local_bc = datatype;
  local_b8 = lastcoord;
  local_a8 = fptr;
  local_58 = blc[2];
  if (*firstcoord == 0) {
    lVar2 = firstcoord[1];
  }
  else {
    lVar2 = *firstcoord + 1;
    blc[1] = firstcoord[1] + 1;
    if (lastcoord[1] == firstcoord[1]) {
      lVar3 = *lastcoord + 1;
    }
    else {
      lVar3 = *naxes;
    }
    blc[0] = lVar2;
    local_68 = lVar3;
    local_60 = blc[1];
    fits_read_compressed_img
              (fptr,datatype,blc,&local_68,inc,nullcheck,nullval,array,nullarray,&tnull,status);
    lVar3 = (lVar3 - lVar2) + 1;
    *nread = *nread + lVar3;
    if ((anynul != (int *)0x0) && (tnull != 0)) {
      *anynul = 1;
    }
    if (local_b8[1] == firstcoord[1]) goto LAB_001c68e8;
    *firstcoord = 0;
    lVar2 = firstcoord[1] + 1;
    firstcoord[1] = lVar2;
    array = (void *)((long)array + lVar3 * local_b0);
    if (nullarray == (char *)0x0) {
      lVar3 = 0;
    }
    lVar1 = 0;
    if (nullcheck == 2) {
      lVar1 = lVar3;
    }
    nullarray = nullarray + lVar1;
  }
  blc[0] = 1;
  local_68 = *naxes;
  lVar3 = (ulong)(*local_b8 + 1 == local_68) + local_b8[1];
  if (lVar2 < lVar3) {
    local_a0 = nullarray;
    blc[1] = lVar2 + 1;
    local_60 = lVar3;
    fits_read_compressed_img
              (local_a8,local_bc,blc,&local_68,inc,nullcheck,nullval,array,nullarray,&tnull,status);
    lVar2 = (lVar3 - (lVar2 + 1)) + 1;
    *nread = *nread + *naxes * lVar2;
    if ((anynul != (int *)0x0) && (tnull != 0)) {
      *anynul = 1;
    }
    blc[1] = local_b8[1] + 1;
    if (blc[1] == lVar3) goto LAB_001c68e8;
    lVar2 = lVar2 * *naxes;
    array = (void *)((long)array + local_b0 * lVar2);
    if (local_a0 == (char *)0x0) {
      lVar2 = 0;
    }
    lVar1 = 0;
    if (nullcheck == 2) {
      lVar1 = lVar2;
    }
    nullarray = local_a0 + lVar1;
  }
  else {
    blc[1] = local_b8[1] + 1;
  }
  if (lVar3 != blc[1]) {
    local_68 = *local_b8 + 1;
    local_60 = blc[1];
    fits_read_compressed_img
              (local_a8,local_bc,blc,&local_68,inc,nullcheck,nullval,array,nullarray,&tnull,status);
    if ((anynul != (int *)0x0) && (tnull != 0)) {
      *anynul = 1;
    }
    *nread = ((*nread + local_68) - blc[0]) + 1;
  }
LAB_001c68e8:
  return *status;
}

Assistant:

int fits_read_compressed_img_plane(fitsfile *fptr, /* I - FITS file   */
            int  datatype,  /* I - datatype of the array to be returned      */
            int  bytesperpixel, /* I - number of bytes per pixel in array */
            long   nplane,  /* I - which plane of the cube to read      */
            LONGLONG *firstcoord,  /* coordinate of first pixel to read */
            LONGLONG *lastcoord,   /* coordinate of last pixel to read */
            long *inc,         /* increment of pixels to read */
            long *naxes,      /* size of each image dimension */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            long *nread,      /* O - total number of pixels read and returned*/
            int  *status)     /* IO - error status                           */

   /*
           in general we have to read the first partial row of the image,
           followed by the middle complete rows, followed by the last
           partial row of the image.  If the first or last rows are complete,
           then read them at the same time as all the middle rows.
    */
{
     /* bottom left coord. and top right coord. */
    LONGLONG blc[MAX_COMPRESS_DIM], trc[MAX_COMPRESS_DIM]; 
    char *arrayptr, *nullarrayptr;
    int tnull;

    if (anynul)
        *anynul = 0;

    *nread = 0;

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    blc[2] = nplane + 1;
    trc[2] = nplane + 1;

    if (firstcoord[0] != 0)
    { 
            /* have to read a partial first row */
            blc[0] = firstcoord[0] + 1;
            blc[1] = firstcoord[1] + 1;
            trc[1] = blc[1];  
            if (lastcoord[1] == firstcoord[1])
               trc[0] = lastcoord[0] + 1; /* 1st and last pixels in same row */
            else
               trc[0] = naxes[0];  /* read entire rest of the row */

            fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

            *nread = *nread + (long) (trc[0] - blc[0] + 1);

            if (tnull && anynul)
               *anynul = 1;  /* there are null pixels */

            if (lastcoord[1] == firstcoord[1])
            {
               return(*status);  /* finished */
            }

            /* set starting coord to beginning of next line */
            firstcoord[0] = 0;
            firstcoord[1] += 1;
            arrayptr = arrayptr + (trc[0] - blc[0] + 1) * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[0] - blc[0] + 1);

    }

    /* read contiguous complete rows of the image, if any */
    blc[0] = 1;
    blc[1] = firstcoord[1] + 1;
    trc[0] = naxes[0];

    if (lastcoord[0] + 1 == naxes[0])
    {
            /* can read the last complete row, too */
            trc[1] = lastcoord[1] + 1;
    }
    else
    {
            /* last row is incomplete; have to read it separately */
            trc[1] = lastcoord[1];
    }

    if (trc[1] >= blc[1])  /* must have at least one whole line to read */
    {
        fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

        *nread = *nread + (long) ((trc[1] - blc[1] + 1) * naxes[0]);

        if (tnull && anynul)
           *anynul = 1;

        if (lastcoord[1] + 1 == trc[1])
               return(*status);  /* finished */

        /* increment pointers for the last partial row */
        arrayptr = arrayptr + (trc[1] - blc[1] + 1) * naxes[0] * bytesperpixel;
        if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + (trc[1] - blc[1] + 1) * naxes[0];
     }

    if (trc[1] == lastcoord[1] + 1)
        return(*status);           /* all done */

    /* set starting and ending coord to last line */

    trc[0] = lastcoord[0] + 1;
    trc[1] = lastcoord[1] + 1;
    blc[1] = trc[1];

    fits_read_compressed_img(fptr, datatype, blc, trc, inc,
                nullcheck, nullval, arrayptr, nullarrayptr, &tnull, status);

    if (tnull && anynul)
       *anynul = 1;

    *nread = *nread + (long) (trc[0] - blc[0] + 1);

    return(*status);
}